

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O3

void __thiscall
swrenderer::DrawColumnRt4TranslatedPalCommand::Execute
          (DrawColumnRt4TranslatedPalCommand *this,DrawerThread *thread)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint8_t *puVar4;
  ulong uVar5;
  uint uVar6;
  byte *pbVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  
  iVar2 = (this->super_PalRtCommand).yl;
  uVar6 = ((this->super_PalRtCommand).yh - iVar2) + 1;
  uVar10 = thread->pass_end_y - iVar2;
  if ((int)uVar10 < 1) {
    uVar10 = 0;
  }
  if ((int)uVar6 < (int)uVar10) {
    uVar10 = uVar6;
  }
  iVar3 = thread->num_cores;
  uVar6 = thread->pass_start_y - iVar2;
  if ((int)uVar6 < 1) {
    uVar6 = 0;
  }
  iVar9 = (iVar3 - (int)((iVar2 + uVar6) - thread->core) % iVar3) % iVar3;
  uVar5 = (long)(int)((~uVar6 + iVar3 + uVar10) - iVar9) / (long)iVar3;
  if (0 < (int)uVar5) {
    pbVar7 = thread->dc_temp + ((int)(iVar9 + iVar2 + uVar6) / iVar3 << 2);
    puVar4 = (this->super_PalRtCommand)._translation;
    if ((int)uVar5 != 1) {
      uVar8 = (uVar5 & 0xffffffff) >> 1;
      do {
        bVar1 = puVar4[pbVar7[1]];
        *pbVar7 = puVar4[*pbVar7];
        pbVar7[1] = bVar1;
        bVar1 = puVar4[pbVar7[3]];
        pbVar7[2] = puVar4[pbVar7[2]];
        pbVar7[3] = bVar1;
        bVar1 = puVar4[pbVar7[5]];
        pbVar7[4] = puVar4[pbVar7[4]];
        pbVar7[5] = bVar1;
        bVar1 = puVar4[pbVar7[7]];
        pbVar7[6] = puVar4[pbVar7[6]];
        pbVar7[7] = bVar1;
        pbVar7 = pbVar7 + 8;
        uVar10 = (int)uVar8 - 1;
        uVar8 = (ulong)uVar10;
      } while (uVar10 != 0);
    }
    if ((uVar5 & 1) != 0) {
      bVar1 = puVar4[pbVar7[1]];
      *pbVar7 = puVar4[*pbVar7];
      pbVar7[1] = bVar1;
      bVar1 = puVar4[pbVar7[3]];
      pbVar7[2] = puVar4[pbVar7[2]];
      pbVar7[3] = bVar1;
    }
  }
  return;
}

Assistant:

void DrawColumnRt4TranslatedPalCommand::Execute(DrawerThread *thread)
	{
		int count = yh - yl + 1;
		count = thread->count_for_thread(yl, count);
		if (count <= 0)
			return;

		uint8_t *source = &thread->dc_temp[thread->temp_line_for_thread(yl)*4];
		const uint8_t *translation = _translation;
		int c0, c1;
		uint8_t b0, b1;

		// Do 2 rows at a time.
		for (int count8 = count >> 1; count8; --count8)
		{
			c0 = source[0];			c1 = source[1];
			b0 = translation[c0];	b1 = translation[c1];
			source[0] = b0;			source[1] = b1;

			c0 = source[2];			c1 = source[3];
			b0 = translation[c0];	b1 = translation[c1];
			source[2] = b0;			source[3] = b1;

			c0 = source[4];			c1 = source[5];
			b0 = translation[c0];	b1 = translation[c1];
			source[4] = b0;			source[5] = b1;

			c0 = source[6];			c1 = source[7];
			b0 = translation[c0];	b1 = translation[c1];
			source[6] = b0;			source[7] = b1;

			source += 8;
		}
		// Do the final row if count was odd.
		if (count & 1)
		{
			c0 = source[0];			c1 = source[1];
			b0 = translation[c0];	b1 = translation[c1];
			source[0] = b0;			source[1] = b1;

			c0 = source[2];			c1 = source[3];
			b0 = translation[c0];	b1 = translation[c1];
			source[2] = b0;			source[3] = b1;
		}
	}